

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O2

void read_failure_test(void)

{
  fdb_doc *pfVar1;
  size_t sVar2;
  void *pvVar3;
  fdb_doc *pfVar4;
  void *pvVar5;
  long lVar6;
  fdb_kvs_handle *pfVar7;
  fdb_status fVar8;
  int iVar9;
  anomalous_callbacks *cbs;
  size_t sVar10;
  size_t metalen;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  size_t asStack_e00 [3];
  fdb_doc *local_de8 [300];
  char local_488 [8];
  char temp [256];
  char metabuf [256];
  char bodybuf [256];
  fdb_config fconfig;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_doc *local_58;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fail_ctx_t fail_ctx;
  fdb_kvs_handle *db;
  
  asStack_e00[2] = 0x104560;
  gettimeofday((timeval *)&fconfig.num_blocks_readahead,(__timezone_ptr_t)0x0);
  asStack_e00[2] = 0x104565;
  memleak_start();
  asStack_e00[2] = 0x10456a;
  cbs = get_default_anon_cbs();
  fail_ctx.num_fails = 0;
  dbfile = (fdb_file_handle *)0x0;
  cbs->pread_cb = pread_failure_cb;
  asStack_e00[2] = 0x104590;
  system("rm -rf  anomaly_test* > errorlog.txt");
  asStack_e00[2] = 0x10459b;
  filemgr_ops_anomalous_init(cbs,&dbfile);
  fail_ctx.num_fails = 1000;
  asStack_e00[2] = 0x1045b1;
  fdb_get_default_config();
  asStack_e00[2] = 0x1045ba;
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.purging_interval = 1;
  fconfig.wal_threshold._4_4_ = 0;
  fconfig.flags._3_1_ = 0;
  lVar6 = -((long)(bodybuf._252_4_ + -0x100) + 0xfU & 0xfffffffffffffff0);
  pcVar14 = (char *)((long)local_de8 + lVar6);
  *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104604;
  fVar8 = fdb_open((fdb_file_handle **)&rdoc,"./anomaly_test1",(fdb_config *)(bodybuf + 0xf8));
  pfVar1 = rdoc;
  if (fVar8 != FDB_RESULT_SUCCESS) {
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104abe;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0xf2);
    read_failure_test()::__test_pass = 1;
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104ae0;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0xf2,"void read_failure_test()");
  }
  *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x10461d;
  fVar8 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfVar1,(fdb_kvs_handle **)&fail_ctx.start_failing_after,
                     (fdb_kvs_config *)&__test_begin.tv_usec);
  pfVar7 = stack0xffffffffffffffc8;
  if (fVar8 != FDB_RESULT_SUCCESS) {
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104b07;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0xf4);
    read_failure_test()::__test_pass = 1;
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104b29;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0xf4,"void read_failure_test()");
  }
  *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x10463c;
  fVar8 = fdb_set_log_callback(pfVar7,logCallbackFunc,"read_failure_test");
  if (fVar8 != FDB_RESULT_SUCCESS) {
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104b50;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0xf8);
    read_failure_test()::__test_pass = 1;
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104b72;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0xf8,"void read_failure_test()");
  }
  lVar13 = 0;
  uVar15 = 0;
  while (pfVar1 = rdoc, uVar15 != 300) {
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x10466e;
    sprintf(pcVar14,"key%d",uVar15 & 0xffffffff);
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104689;
    sprintf(temp + 0xf8,"meta%d",uVar15 & 0xffffffff);
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x1046a1;
    sprintf(metabuf + 0xf8,"body%d",uVar15 & 0xffffffff);
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x1046b7;
    sVar10 = strlen(pcVar14);
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x1046c2;
    metalen = strlen(temp + 0xf8);
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x1046d1;
    sVar11 = strlen(metabuf + 0xf8);
    *(size_t *)((long)asStack_e00 + lVar6 + 8) = sVar11;
    *(undefined8 *)((long)asStack_e00 + lVar6) = 0x1046f6;
    fdb_doc_create((fdb_doc **)((long)local_de8 + lVar13),pcVar14,sVar10,temp + 0xf8,metalen,
                   metabuf + 0xf8,*(size_t *)((long)asStack_e00 + lVar6 + 8));
    pfVar7 = stack0xffffffffffffffc8;
    pfVar1 = local_de8[uVar15];
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104709;
    fVar8 = fdb_set(pfVar7,pfVar1);
    uVar15 = uVar15 + 1;
    lVar13 = lVar13 + 8;
    if (fVar8 != FDB_RESULT_SUCCESS) {
      *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x10473f;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x102);
      read_failure_test()::__test_pass = 1;
      *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104761;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x102,"void read_failure_test()");
    }
  }
  *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x10476c;
  fVar8 = fdb_commit((fdb_file_handle *)pfVar1,'\0');
  pfVar7 = stack0xffffffffffffffc8;
  if (fVar8 != FDB_RESULT_SUCCESS) {
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104b99;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x107);
    read_failure_test()::__test_pass = 1;
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104bbb;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0x107,"void read_failure_test()");
  }
  *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x10477d;
  fdb_kvs_close(pfVar7);
  pfVar1 = rdoc;
  *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104789;
  fdb_close((fdb_file_handle *)pfVar1);
  fail_ctx.num_fails = dbfile._4_4_;
  *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x1047a5;
  fVar8 = fdb_open((fdb_file_handle **)&rdoc,"./anomaly_test1",(fdb_config *)(bodybuf + 0xf8));
  if ((fVar8 != FDB_RESULT_SB_READ_FAIL) && (fVar8 != FDB_RESULT_READ_FAIL)) {
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104d06;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x10e);
    read_failure_test()::__test_pass = 1;
    *(code **)((long)local_de8 + lVar6 + -8) = bad_thread;
    __assert_fail("status == FDB_RESULT_READ_FAIL || status == FDB_RESULT_SB_READ_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0x10e,"void read_failure_test()");
  }
  fail_ctx.num_fails = dbfile._4_4_ + 1000;
  *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x1047d5;
  fVar8 = fdb_open((fdb_file_handle **)&rdoc,"./anomaly_test1",(fdb_config *)(bodybuf + 0xf8));
  pfVar1 = rdoc;
  if (fVar8 != FDB_RESULT_SUCCESS) {
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104be2;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x113);
    read_failure_test()::__test_pass = 1;
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104c04;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0x113,"void read_failure_test()");
  }
  *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x1047ee;
  fVar8 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfVar1,(fdb_kvs_handle **)&fail_ctx.start_failing_after,
                     (fdb_kvs_config *)&__test_begin.tv_usec);
  pfVar7 = stack0xffffffffffffffc8;
  if (fVar8 != FDB_RESULT_SUCCESS) {
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104c2b;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x115);
    read_failure_test()::__test_pass = 1;
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104c4d;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0x115,"void read_failure_test()");
  }
  *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x10480d;
  fVar8 = fdb_set_log_callback(pfVar7,logCallbackFunc,"read_failure_test");
  if (fVar8 != FDB_RESULT_SUCCESS) {
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104c74;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x119);
    read_failure_test()::__test_pass = 1;
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104c96;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0x119,"void read_failure_test()");
  }
  fail_ctx.num_fails = dbfile._4_4_;
  sVar2 = local_de8[0]->keylen;
  pvVar3 = local_de8[0]->key;
  *(undefined8 *)((long)asStack_e00 + lVar6 + 8) = 0;
  *(undefined8 *)((long)asStack_e00 + lVar6) = 0x104846;
  fdb_doc_create(&local_58,pvVar3,sVar2,(void *)0x0,0,(void *)0x0,
                 *(size_t *)((long)asStack_e00 + lVar6 + 8));
  pfVar7 = stack0xffffffffffffffc8;
  pfVar1 = local_58;
  *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104854;
  fVar8 = fdb_get(pfVar7,pfVar1);
  pfVar1 = local_58;
  if (fVar8 == FDB_RESULT_READ_FAIL) {
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104869;
    fdb_doc_free(pfVar1);
    fail_ctx.num_fails = dbfile._4_4_ + 1000;
    lVar13 = 0;
    while( true ) {
      if (lVar13 == 300) {
        *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104924;
        fdb_kvs_close(stack0xffffffffffffffc8);
        *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x10492d;
        fdb_close((fdb_file_handle *)rdoc);
        for (lVar13 = 0; lVar13 != 300; lVar13 = lVar13 + 1) {
          pfVar1 = local_de8[lVar13];
          *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104945;
          fdb_doc_free(pfVar1);
        }
        *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x10494f;
        fdb_shutdown();
        *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104954;
        memleak_end();
        uVar12 = (ulong)dbfile & 0xffffffff;
        uVar15 = (ulong)dbfile >> 0x20;
        *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104972;
        sprintf(local_488,"read failure test: %d failures out of %d reads",uVar12,uVar15);
        pcVar14 = "%s PASSED\n";
        if (read_failure_test()::__test_pass != '\0') {
          pcVar14 = "%s FAILED\n";
        }
        *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x10499f;
        fprintf(_stderr,pcVar14,local_488);
        return;
      }
      sVar2 = local_de8[lVar13]->keylen;
      pvVar3 = local_de8[lVar13]->key;
      *(undefined8 *)((long)asStack_e00 + lVar6 + 8) = 0;
      *(undefined8 *)((long)asStack_e00 + lVar6) = 0x1048aa;
      fdb_doc_create(&local_58,pvVar3,sVar2,(void *)0x0,0,(void *)0x0,
                     *(size_t *)((long)asStack_e00 + lVar6 + 8));
      pfVar7 = stack0xffffffffffffffc8;
      pfVar1 = local_58;
      *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x1048b9;
      fVar8 = fdb_get(pfVar7,pfVar1);
      pfVar1 = local_58;
      if (fVar8 != FDB_RESULT_SUCCESS) {
        *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104a25;
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,299);
        read_failure_test()::__test_pass = 1;
        *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104a47;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,299,"void read_failure_test()");
      }
      sVar10 = local_58->metalen;
      pvVar3 = local_58->meta;
      pfVar4 = local_de8[lVar13];
      pvVar5 = pfVar4->meta;
      *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x1048e4;
      iVar9 = bcmp(pvVar3,pvVar5,sVar10);
      if (iVar9 != 0) {
        *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x1049dc;
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar5,pvVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,300);
        read_failure_test()::__test_pass = 1;
        *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x1049fe;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,300,"void read_failure_test()");
      }
      sVar10 = pfVar1->bodylen;
      pvVar3 = pfVar1->body;
      pvVar5 = pfVar4->body;
      *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104903;
      iVar9 = bcmp(pvVar3,pvVar5,sVar10);
      if (iVar9 != 0) break;
      *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104913;
      fdb_doc_free(pfVar1);
      lVar13 = lVar13 + 1;
    }
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104a75;
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar5,pvVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x12d);
    read_failure_test()::__test_pass = 1;
    *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104a97;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0x12d,"void read_failure_test()");
  }
  *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104cbd;
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
          ,0x120);
  read_failure_test()::__test_pass = 1;
  *(undefined8 *)((long)local_de8 + lVar6 + -8) = 0x104cdf;
  __assert_fail("status == FDB_RESULT_READ_FAIL",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x120,"void read_failure_test()");
}

Assistant:

void read_failure_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n=300;
    int keylen_limit;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char *keybuf;
    char metabuf[256], bodybuf[256], temp[256];
    // Get the default callbacks which result in normal operation for other ops
    struct anomalous_callbacks *read_fail_cb = get_default_anon_cbs();
    fail_ctx_t fail_ctx;
    memset(&fail_ctx, 0, sizeof(fail_ctx_t));

    // Modify the pread callback to redirect to test-specific function
    read_fail_cb->pread_cb = &pread_failure_cb;

    // remove previous anomaly_test files
    r = system(SHELL_DEL" anomaly_test* > errorlog.txt");
    (void)r;

    // Reset anomalous behavior stats..
    filemgr_ops_anomalous_init(read_fail_cb, &fail_ctx);

    fail_ctx.start_failing_after = 1000; // some large value

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    keylen_limit = fconfig.blocksize - 256;
    keybuf = alca(char, keylen_limit);

    // open db
    status = fdb_open(&dbfile, "./anomaly_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "read_failure_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(db, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // commit
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    fail_ctx.start_failing_after = fail_ctx.num_ops; // immediately fail

    status = fdb_open(&dbfile, "./anomaly_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_READ_FAIL || status == FDB_RESULT_SB_READ_FAIL);

    fail_ctx.start_failing_after = fail_ctx.num_ops+1000; //normal operation

    status = fdb_open(&dbfile, "./anomaly_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "read_failure_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fail_ctx.start_failing_after = fail_ctx.num_ops; // immediately fail
    i = 0;
    fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);

    TEST_CHK(status == FDB_RESULT_READ_FAIL);
    // free result document
    fdb_doc_free(rdoc);

    fail_ctx.start_failing_after = fail_ctx.num_ops+1000; //normal operation
    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        // free result document
        fdb_doc_free(rdoc);
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(temp, "read failure test: %d failures out of %d reads",
            fail_ctx.num_fails, fail_ctx.num_ops);

    TEST_RESULT(temp);
}